

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O1

void btreeblk_init(btreeblk_handle *handle,filemgr *file,uint32_t nodesize)

{
  uint uVar1;
  btreeblk_subblocks *pbVar2;
  void *__s;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  
  handle->file = file;
  handle->nodesize = nodesize;
  uVar3 = 0;
  handle->nnodeperblock = (uint16_t)(file->blocksize / nodesize);
  (handle->blockpool).head = (list_elem *)0x0;
  (handle->blockpool).tail = (list_elem *)0x0;
  handle->nlivenodes = 0;
  handle->ndeltanodes = 0;
  (handle->alc_list).head = (list_elem *)0x0;
  (handle->alc_list).tail = (list_elem *)0x0;
  (handle->read_list).head = (list_elem *)0x0;
  (handle->read_list).tail = (list_elem *)0x0;
  handle->dirty_update = (filemgr_dirty_update_node *)0x0;
  handle->dirty_update_writer = (filemgr_dirty_update_node *)0x0;
  if (0x80 < nodesize) {
    uVar1 = 0x80;
    uVar4 = 0;
    do {
      uVar1 = uVar1 * 2;
      uVar3 = uVar4 + 1;
      if (nodesize <= uVar1) break;
      bVar7 = uVar4 < 4;
      uVar4 = uVar3;
    } while (bVar7);
  }
  handle->nsb = uVar3;
  if (uVar3 == 0) {
    handle->sb = (btreeblk_subblocks *)0x0;
  }
  else {
    pbVar2 = (btreeblk_subblocks *)malloc((ulong)uVar3 * 0x18);
    handle->sb = pbVar2;
    if (handle->nsb != 0) {
      uVar3 = 0x80;
      lVar6 = 0x10;
      uVar5 = 0;
      do {
        pbVar2 = handle->sb;
        *(undefined8 *)((long)pbVar2 + lVar6 + -0x10) = 0xffffffffffffffff;
        *(uint *)((long)pbVar2 + lVar6 + -8) = uVar3;
        *(short *)((long)pbVar2 + lVar6 + -4) = (short)((ulong)nodesize / (ulong)uVar3);
        __s = malloc((ulong)nodesize / (ulong)uVar3 & 0xffff);
        *(void **)((long)&pbVar2->bid + lVar6) = __s;
        memset(__s,0,(ulong)*(ushort *)((long)pbVar2 + lVar6 + -4));
        uVar3 = uVar3 * 2;
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x18;
      } while (uVar5 < handle->nsb);
    }
  }
  return;
}

Assistant:

void btreeblk_init(struct btreeblk_handle *handle, struct filemgr *file,
                   uint32_t nodesize)
{
    uint32_t i;
    uint32_t _nodesize;

    handle->file = file;
    handle->nodesize = nodesize;
    handle->nnodeperblock = handle->file->blocksize / handle->nodesize;
    handle->nlivenodes = 0;
    handle->ndeltanodes = 0;
    handle->dirty_update = NULL;
    handle->dirty_update_writer = NULL;

    list_init(&handle->alc_list);
    list_init(&handle->read_list);

#ifdef __BTREEBLK_BLOCKPOOL
    list_init(&handle->blockpool);
#endif

    // compute # subblock sets
    _nodesize = BTREEBLK_MIN_SUBBLOCK;
    for (i=0; (_nodesize < nodesize && i<5); ++i){
        _nodesize = _nodesize << 1;
    }
    handle->nsb = i;
    if (handle->nsb) {
        handle->sb = (struct btreeblk_subblocks*)
                     malloc(sizeof(struct btreeblk_subblocks) * handle->nsb);
        // initialize each subblock set
        _nodesize = BTREEBLK_MIN_SUBBLOCK;
        for (i=0;i<handle->nsb;++i){
            handle->sb[i].bid = BLK_NOT_FOUND;
            handle->sb[i].sb_size = _nodesize;
            handle->sb[i].nblocks = nodesize / _nodesize;
            handle->sb[i].bitmap = (uint8_t*)malloc(handle->sb[i].nblocks);
            memset(handle->sb[i].bitmap, 0, handle->sb[i].nblocks);
            _nodesize = _nodesize << 1;
        }
    } else {
        handle->sb = NULL;
    }
}